

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O3

void __thiscall FMapInfoParser::ParseSkill(FMapInfoParser *this)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  byte bVar7;
  ulong uVar9;
  FString *this_00;
  double dVar10;
  FName local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  char *local_120;
  FSkillInfo local_118;
  FSkillInfo *pFVar8;
  
  FSkillInfo::FSkillInfo(&local_118);
  local_118.AmmoFactor = 1.0;
  local_118.DoubleAmmoFactor = 2.0;
  local_118.DropAmmoFactor = -1.0;
  local_118.DamageFactor = 1.0;
  local_118.ArmorFactor = 1.0;
  local_118.HealthFactor = 1.0;
  local_118.RespawnCounter = 0;
  local_118.RespawnLimit = 0;
  local_118.FastMonsters = false;
  local_118.SlowMonsters = false;
  local_118.DisableCheats = false;
  local_118.AutoUseHealth = false;
  local_118.EasyBossBrain = false;
  local_118.EasyKey = false;
  pFVar8 = (FSkillInfo *)0x0;
  local_118.Aggressiveness = 1.0;
  local_118.SpawnFilter = 0;
  local_118.ACSReturn = 0;
  local_118.MustConfirm = false;
  local_118.Shortcut = '\0';
  FString::operator=(&local_118.TextColor,(char *)"");
  M_Free(local_118.Replace.Nodes);
  local_118.Replace.Nodes = (Node *)0x0;
  local_118.Replace.LastFree = (Node *)0x0;
  local_118.Replace.Size = 0;
  local_118.Replace.NumUsed = 0;
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::SetNodeVector(&local_118.Replace,1);
  M_Free(local_118.Replaced.Nodes);
  local_118.Replaced.Nodes = (Node *)0x0;
  local_118.Replaced.LastFree = (Node *)0x0;
  local_118.Replaced.Size = 0;
  local_118.Replaced.NumUsed = 0;
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::SetNodeVector(&local_118.Replaced,1)
  ;
  local_118.MonsterHealth = 1.0;
  local_118.FriendlyHealth = 1.0;
  local_118.NoPain = false;
  local_118.Infighting = 0;
  FScanner::MustGetString(&this->sc);
  local_118.Name.Index = FName::NameManager::FindName(&FName::NameData,(this->sc).String,false);
  ParseOpenBrace(this);
  local_128 = 0;
  local_124 = 0;
LAB_004e62ae:
  bVar3 = FScanner::GetString(&this->sc);
  if (bVar3) {
    bVar3 = FScanner::Compare(&this->sc,"ammofactor");
    if (bVar3) {
      ParseAssign(this);
      FScanner::MustGetFloat(&this->sc);
      local_118.AmmoFactor = (this->sc).Float;
    }
    else {
      bVar3 = FScanner::Compare(&this->sc,"doubleammofactor");
      if (bVar3) {
        ParseAssign(this);
        FScanner::MustGetFloat(&this->sc);
        local_118.DoubleAmmoFactor = (this->sc).Float;
      }
      else {
        bVar3 = FScanner::Compare(&this->sc,"dropammofactor");
        if (bVar3) {
          ParseAssign(this);
          FScanner::MustGetFloat(&this->sc);
          local_118.DropAmmoFactor = (this->sc).Float;
        }
        else {
          bVar3 = FScanner::Compare(&this->sc,"damagefactor");
          if (bVar3) {
            ParseAssign(this);
            FScanner::MustGetFloat(&this->sc);
            local_118.DamageFactor = (this->sc).Float;
          }
          else {
            bVar3 = FScanner::Compare(&this->sc,"fastmonsters");
            if (bVar3) {
              local_118.FastMonsters = true;
            }
            else {
              bVar3 = FScanner::Compare(&this->sc,"slowmonsters");
              if (bVar3) {
                local_118.SlowMonsters = true;
              }
              else {
                bVar3 = FScanner::Compare(&this->sc,"disablecheats");
                if (bVar3) {
                  local_118.DisableCheats = true;
                }
                else {
                  bVar3 = FScanner::Compare(&this->sc,"easybossbrain");
                  if (bVar3) {
                    local_118.EasyBossBrain = true;
                  }
                  else {
                    bVar3 = FScanner::Compare(&this->sc,"easykey");
                    if (bVar3) {
                      local_118.EasyKey = true;
                    }
                    else {
                      bVar3 = FScanner::Compare(&this->sc,"autousehealth");
                      if (bVar3) {
                        local_118.AutoUseHealth = true;
                      }
                      else {
                        bVar3 = FScanner::Compare(&this->sc,"respawntime");
                        if (bVar3) {
                          ParseAssign(this);
                          FScanner::MustGetFloat(&this->sc);
                          local_118.RespawnCounter = (int)((this->sc).Float * 35.0);
                        }
                        else {
                          bVar3 = FScanner::Compare(&this->sc,"respawnlimit");
                          if (bVar3) {
                            ParseAssign(this);
                            FScanner::MustGetNumber(&this->sc);
                            local_118.RespawnLimit = (this->sc).Number;
                          }
                          else {
                            bVar3 = FScanner::Compare(&this->sc,"Aggressiveness");
                            if (bVar3) {
                              ParseAssign(this);
                              FScanner::MustGetFloat(&this->sc);
                              dVar1 = (this->sc).Float;
                              dVar10 = 1.0;
                              if (dVar1 <= 1.0) {
                                dVar10 = dVar1;
                              }
                              local_118.Aggressiveness =
                                   (double)(~-(ulong)(0.0 < dVar1) & 0x3ff0000000000000 |
                                           (ulong)(1.0 - dVar10) & -(ulong)(0.0 < dVar1));
                            }
                            else {
                              bVar3 = FScanner::Compare(&this->sc,"SpawnFilter");
                              if (bVar3) {
                                ParseAssign(this);
                                bVar3 = FScanner::CheckNumber(&this->sc);
                                if (bVar3) {
                                  uVar2 = (this->sc).Number;
                                  pFVar8 = (FSkillInfo *)(ulong)uVar2;
                                  if (0 < (int)uVar2) {
                                    bVar7 = (char)uVar2 - 1;
                                    pFVar8 = (FSkillInfo *)(ulong)CONCAT31((int3)(uVar2 >> 8),bVar7)
                                    ;
                                    local_118.SpawnFilter =
                                         local_118.SpawnFilter | 1 << (bVar7 & 0x1f);
                                  }
                                }
                                else {
                                  FScanner::MustGetString(&this->sc);
                                  bVar3 = FScanner::Compare(&this->sc,"baby");
                                  if (bVar3) {
                                    local_118.SpawnFilter = local_118.SpawnFilter | 1;
                                  }
                                  else {
                                    bVar3 = FScanner::Compare(&this->sc,"easy");
                                    if (bVar3) {
                                      local_118.SpawnFilter = local_118.SpawnFilter | 2;
                                    }
                                    else {
                                      bVar3 = FScanner::Compare(&this->sc,"normal");
                                      if (bVar3) {
                                        local_118.SpawnFilter = local_118.SpawnFilter | 4;
                                      }
                                      else {
                                        bVar3 = FScanner::Compare(&this->sc,"hard");
                                        if (bVar3) {
                                          local_118.SpawnFilter = local_118.SpawnFilter | 8;
                                        }
                                        else {
                                          bVar3 = FScanner::Compare(&this->sc,"nightmare");
                                          if (bVar3) {
                                            local_118.SpawnFilter = local_118.SpawnFilter | 0x10;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                bVar3 = FScanner::Compare(&this->sc,"ACSReturn");
                                if (bVar3) {
                                  ParseAssign(this);
                                  FScanner::MustGetNumber(&this->sc);
                                  local_118.ACSReturn = (this->sc).Number;
                                  local_124 = (uint)CONCAT71((uint7)(uint3)((uint)local_118.
                                                                                  ACSReturn >> 8),1)
                                  ;
                                }
                                else {
                                  bVar3 = FScanner::Compare(&this->sc,"ReplaceActor");
                                  if (!bVar3) {
                                    bVar3 = FScanner::Compare(&this->sc,"Name");
                                    if (bVar3) {
                                      ParseAssign(this);
                                      FScanner::MustGetString(&this->sc);
                                      this_00 = &local_118.MenuName;
                                    }
                                    else {
                                      bVar3 = FScanner::Compare(&this->sc,"PlayerClassName");
                                      if (bVar3) {
                                        ParseAssign(this);
                                        FScanner::MustGetString(&this->sc);
                                        local_12c = FName::NameManager::FindName
                                                              (&FName::NameData,(this->sc).String,
                                                               false);
                                        ParseComma(this);
                                        FScanner::MustGetString(&this->sc);
                                        local_120 = (this->sc).String;
                                        local_130.Index = local_12c;
                                        pNVar6 = TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>
                                                 ::GetNode(&local_118.MenuNamesForPlayerClass,
                                                           &local_130);
                                        FString::operator=(&(pNVar6->Pair).Value,local_120);
                                        goto LAB_004e62ae;
                                      }
                                      bVar3 = FScanner::Compare(&this->sc,"PicName");
                                      if (bVar3) {
                                        ParseAssign(this);
                                        FScanner::MustGetString(&this->sc);
                                        this_00 = &local_118.PicName;
                                      }
                                      else {
                                        bVar3 = FScanner::Compare(&this->sc,"MustConfirm");
                                        if (!bVar3) {
                                          bVar3 = FScanner::Compare(&this->sc,"Key");
                                          if (bVar3) {
                                            ParseAssign(this);
                                            FScanner::MustGetString(&this->sc);
                                            iVar4 = tolower((int)*(this->sc).String);
                                            local_118.Shortcut = (char)iVar4;
                                          }
                                          else {
                                            bVar3 = FScanner::Compare(&this->sc,"TextColor");
                                            if (bVar3) {
                                              ParseAssign(this);
                                              FScanner::MustGetString(&this->sc);
                                              FString::Format(&local_118.TextColor,"[%s]",
                                                              (this->sc).String);
                                            }
                                            else {
                                              bVar3 = FScanner::Compare(&this->sc,"MonsterHealth");
                                              if (bVar3) {
                                                ParseAssign(this);
                                                FScanner::MustGetFloat(&this->sc);
                                                local_118.MonsterHealth = (this->sc).Float;
                                              }
                                              else {
                                                bVar3 = FScanner::Compare(&this->sc,"FriendlyHealth"
                                                                         );
                                                if (bVar3) {
                                                  ParseAssign(this);
                                                  FScanner::MustGetFloat(&this->sc);
                                                  local_118.FriendlyHealth = (this->sc).Float;
                                                }
                                                else {
                                                  bVar3 = FScanner::Compare(&this->sc,"NoPain");
                                                  if (bVar3) {
                                                    local_118.NoPain = true;
                                                  }
                                                  else {
                                                    bVar3 = FScanner::Compare(&this->sc,
                                                                              "ArmorFactor");
                                                    if (bVar3) {
                                                      ParseAssign(this);
                                                      FScanner::MustGetFloat(&this->sc);
                                                      local_118.ArmorFactor = (this->sc).Float;
                                                    }
                                                    else {
                                                      bVar3 = FScanner::Compare(&this->sc,
                                                                                "HealthFactor");
                                                      if (bVar3) {
                                                        ParseAssign(this);
                                                        FScanner::MustGetFloat(&this->sc);
                                                        local_118.HealthFactor = (this->sc).Float;
                                                      }
                                                      else {
                                                        bVar3 = FScanner::Compare(&this->sc,
                                                                                  "NoInfighting");
                                                        if (bVar3) {
                                                          local_118.Infighting = 0x4000;
                                                        }
                                                        else {
                                                          bVar3 = FScanner::Compare(&this->sc,
                                                                                                                                                                        
                                                  "TotalInfighting");
                                                  if (bVar3) {
                                                    local_118.Infighting = 0x2000;
                                                  }
                                                  else {
                                                    bVar3 = FScanner::Compare(&this->sc,
                                                                              "DefaultSkill");
                                                    if (bVar3) {
                                                      pFVar8 = (FSkillInfo *)
                                                               CONCAT71((int7)((ulong)pFVar8 >> 8),1
                                                                       );
                                                      local_128 = (uint)pFVar8;
                                                      if (-1 < (long)DefaultSkill) {
                                                        pFVar8 = AllSkills.Array;
                                                        FScanner::ScriptError
                                                                  (&this->sc,
                                                                                                                                      
                                                  "%s is already the default skill\n",
                                                  FName::NameData.NameArray
                                                  [AllSkills.Array[DefaultSkill].Name.Index].Text);
                                                  }
                                                  }
                                                  else {
                                                    bVar3 = ParseCloseBrace(this);
                                                    if (bVar3) goto LAB_004e6a5c;
                                                    FScanner::ScriptMessage
                                                              (&this->sc,
                                                                                                                              
                                                  "Unknown property \'%s\' found in skill definition\n"
                                                  ,(this->sc).String);
                                                  SkipToNext(this);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          goto LAB_004e62ae;
                                        }
                                        local_118.MustConfirm = true;
                                        if (this->format_type == 2) {
                                          bVar3 = CheckAssign(this);
                                          if (!bVar3) goto LAB_004e62ae;
                                          FScanner::MustGetString(&this->sc);
                                          this_00 = &local_118.MustConfirmText;
                                        }
                                        else {
                                          bVar3 = FScanner::CheckToken(&this->sc,0x102);
                                          this_00 = &local_118.MustConfirmText;
                                          if (!bVar3) goto LAB_004e62ae;
                                        }
                                      }
                                    }
                                    FString::operator=(this_00,(this->sc).String);
                                    goto LAB_004e62ae;
                                  }
                                  ParseAssign(this);
                                  FScanner::MustGetString(&this->sc);
                                  local_12c = FName::NameManager::FindName
                                                        (&FName::NameData,(this->sc).String,false);
                                  ParseComma(this);
                                  FScanner::MustGetString(&this->sc);
                                  iVar4 = FName::NameManager::FindName
                                                    (&FName::NameData,(this->sc).String,false);
                                  local_120 = (char *)CONCAT44(local_120._4_4_,iVar4);
                                  local_130.Index = local_12c;
                                  pNVar5 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>
                                           ::GetNode(&local_118.Replace,&local_130);
                                  (pNVar5->Pair).Value.Index = (uint)local_120;
                                  local_130.Index = (uint)local_120;
                                  pNVar5 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>
                                           ::GetNode(&local_118.Replaced,&local_130);
                                  pFVar8 = (FSkillInfo *)(ulong)local_12c;
                                  (pNVar5->Pair).Value.Index = local_12c;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_004e62ae;
  }
LAB_004e6a5c:
  CheckEndOfFile(this,"skill");
  if ((ulong)AllSkills.Count != 0) {
    uVar9 = 0;
    pFVar8 = AllSkills.Array;
    do {
      if ((pFVar8->Name).Index == local_118.Name.Index) {
        if ((local_124 & 1) == 0) {
          local_118.ACSReturn = pFVar8->ACSReturn;
        }
        FSkillInfo::operator=(pFVar8,&local_118);
        if ((local_128 & 1) != 0) {
          DefaultSkill = (int)uVar9;
        }
        goto LAB_004e6ae7;
      }
      uVar9 = uVar9 + 1;
      pFVar8 = pFVar8 + 1;
    } while (AllSkills.Count != uVar9);
  }
  if ((local_124 & 1) == 0) {
    local_118.ACSReturn = AllSkills.Count;
  }
  if ((local_128 & 1) != 0) {
    DefaultSkill = AllSkills.Count;
  }
  TArray<FSkillInfo,_FSkillInfo>::Grow(&AllSkills,1);
  FSkillInfo::FSkillInfo(AllSkills.Array + AllSkills.Count,&local_118);
  AllSkills.Count = AllSkills.Count + 1;
LAB_004e6ae7:
  M_Free(local_118.Replaced.Nodes);
  local_118.Replaced.Nodes = (Node *)0x0;
  local_118.Replaced.LastFree = (Node *)0x0;
  local_118.Replaced.Size = 0;
  local_118.Replaced.NumUsed = 0;
  M_Free(local_118.Replace.Nodes);
  local_118.Replace.Nodes = (Node *)0x0;
  local_118.Replace.LastFree = (Node *)0x0;
  local_118.Replace.Size = 0;
  local_118.Replace.NumUsed = 0;
  FString::~FString(&local_118.TextColor);
  FString::~FString(&local_118.MustConfirmText);
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::ClearNodeVector
            (&local_118.MenuNamesForPlayerClass);
  FString::~FString(&local_118.PicName);
  FString::~FString(&local_118.MenuName);
  return;
}

Assistant:

void FMapInfoParser::ParseSkill ()
{
	FSkillInfo skill;
	bool thisisdefault = false;
	bool acsreturnisset = false;

	skill.AmmoFactor = 1.;
	skill.DoubleAmmoFactor = 2.;
	skill.DropAmmoFactor = -1.;
	skill.DamageFactor = 1.;
	skill.ArmorFactor = 1.;
	skill.HealthFactor = 1.;
	skill.FastMonsters = false;
	skill.SlowMonsters = false;
	skill.DisableCheats = false;
	skill.EasyBossBrain = false;
	skill.EasyKey = false;
	skill.AutoUseHealth = false;
	skill.RespawnCounter = 0;
	skill.RespawnLimit = 0;
	skill.Aggressiveness = 1.;
	skill.SpawnFilter = 0;
	skill.ACSReturn = 0;
	skill.MustConfirm = false;
	skill.Shortcut = 0;
	skill.TextColor = "";
	skill.Replace.Clear();
	skill.Replaced.Clear();
	skill.MonsterHealth = 1.;
	skill.FriendlyHealth = 1.;
	skill.NoPain = false;
	skill.Infighting = 0;

	sc.MustGetString();
	skill.Name = sc.String;

	ParseOpenBrace();

	while (sc.GetString ())
	{
		if (sc.Compare ("ammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.AmmoFactor = sc.Float;
		}
		else if (sc.Compare ("doubleammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DoubleAmmoFactor = sc.Float;
		}
		else if (sc.Compare ("dropammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DropAmmoFactor = sc.Float;
		}
		else if (sc.Compare ("damagefactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DamageFactor = sc.Float;
		}
		else if (sc.Compare ("fastmonsters"))
		{
			skill.FastMonsters = true;
		}
		else if (sc.Compare ("slowmonsters"))
		{
			skill.SlowMonsters = true;
		}
		else if (sc.Compare ("disablecheats"))
		{
			skill.DisableCheats = true;
		}
		else if (sc.Compare ("easybossbrain"))
		{
			skill.EasyBossBrain = true;
		}
		else if (sc.Compare ("easykey"))
		{
			skill.EasyKey = true;
		}
		else if (sc.Compare("autousehealth"))
		{
			skill.AutoUseHealth = true;
		}
		else if (sc.Compare("respawntime"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.RespawnCounter = int(sc.Float*TICRATE);
		}
		else if (sc.Compare("respawnlimit"))
		{
			ParseAssign();
			sc.MustGetNumber ();
			skill.RespawnLimit = sc.Number;
		}
		else if (sc.Compare("Aggressiveness"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.Aggressiveness = 1. - clamp(sc.Float, 0.,1.);
		}
		else if (sc.Compare("SpawnFilter"))
		{
			ParseAssign();
			if (sc.CheckNumber())
			{
				if (sc.Number > 0) skill.SpawnFilter |= (1<<(sc.Number-1));
			}
			else
			{
				sc.MustGetString ();
				if (sc.Compare("baby")) skill.SpawnFilter |= 1;
				else if (sc.Compare("easy")) skill.SpawnFilter |= 2;
				else if (sc.Compare("normal")) skill.SpawnFilter |= 4;
				else if (sc.Compare("hard")) skill.SpawnFilter |= 8;
				else if (sc.Compare("nightmare")) skill.SpawnFilter |= 16;
			}
		}
		else if (sc.Compare("ACSReturn"))
		{
			ParseAssign();
			sc.MustGetNumber ();
			skill.ACSReturn = sc.Number;
			acsreturnisset = true;
		}
		else if (sc.Compare("ReplaceActor"))
		{
			ParseAssign();
			sc.MustGetString();
			FName replaced = sc.String;
			ParseComma();
			sc.MustGetString();
			FName replacer = sc.String;
			skill.SetReplacement(replaced, replacer);
			skill.SetReplacedBy(replacer, replaced);
		}
		else if (sc.Compare("Name"))
		{
			ParseAssign();
			sc.MustGetString ();
			skill.MenuName = sc.String;
		}
		else if (sc.Compare("PlayerClassName"))
		{
			ParseAssign();
			sc.MustGetString ();
			FName pc = sc.String;
			ParseComma();
			sc.MustGetString ();
			skill.MenuNamesForPlayerClass[pc]=sc.String;
		}
		else if (sc.Compare("PicName"))
		{
			ParseAssign();
			sc.MustGetString ();
			skill.PicName = sc.String;
		}
		else if (sc.Compare("MustConfirm"))
		{
			skill.MustConfirm = true;
			if (format_type == FMT_New) 
			{
				if (CheckAssign())
				{
					sc.MustGetString();
					skill.MustConfirmText = sc.String;
				}
			}
			else
			{
				if (sc.CheckToken(TK_StringConst))
				{
					skill.MustConfirmText = sc.String;
				}
			}
		}
		else if (sc.Compare("Key"))
		{
			ParseAssign();
			sc.MustGetString();
			skill.Shortcut = tolower(sc.String[0]);
		}
		else if (sc.Compare("TextColor"))
		{
			ParseAssign();
			sc.MustGetString();
			skill.TextColor.Format("[%s]", sc.String);
		}
		else if (sc.Compare("MonsterHealth"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.MonsterHealth = sc.Float;	
		}
		else if (sc.Compare("FriendlyHealth"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.FriendlyHealth = sc.Float;
		}
		else if (sc.Compare("NoPain"))
		{
			skill.NoPain = true;
		}
		else if (sc.Compare("ArmorFactor"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.ArmorFactor = sc.Float;
		}
		else if (sc.Compare("HealthFactor"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.HealthFactor = sc.Float;
		}
		else if (sc.Compare("NoInfighting"))
		{
			skill.Infighting = LEVEL2_NOINFIGHTING;
		}
		else if (sc.Compare("TotalInfighting"))
		{
			skill.Infighting = LEVEL2_TOTALINFIGHTING;
		}
		else if (sc.Compare("DefaultSkill"))
		{
			if (DefaultSkill >= 0)
			{
				sc.ScriptError("%s is already the default skill\n", AllSkills[DefaultSkill].Name.GetChars());
			}
			thisisdefault = true;
		}
		else if (!ParseCloseBrace())
		{
			// Unknown
			sc.ScriptMessage("Unknown property '%s' found in skill definition\n", sc.String);
			SkipToNext();
		}
		else
		{
			break;
		}
	}
	CheckEndOfFile("skill");
	for(unsigned int i = 0; i < AllSkills.Size(); i++)
	{
		if (AllSkills[i].Name == skill.Name)
		{
			if (!acsreturnisset)
			{ // Use the ACS return for the skill we are overwriting.
				skill.ACSReturn = AllSkills[i].ACSReturn;
			}
			AllSkills[i] = skill;
			if (thisisdefault)
			{
				DefaultSkill = i;
			}
			return;
		}
	}
	if (!acsreturnisset)
	{
		skill.ACSReturn = AllSkills.Size();
	}
	if (thisisdefault)
	{
		DefaultSkill = AllSkills.Size();
	}
	AllSkills.Push(skill);
}